

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_TestShell::
createTest(TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_TestShell
           *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockHierarchyTest.cpp"
                                  ,0x81);
  TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_Test::
  TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_Test
            ((TEST_MockHierarchyTest_checkExpectationsWorksHierarchicallyForLastCallNotFinished_Test
              *)this_00);
  return this_00;
}

Assistant:

TEST(MockHierarchyTest, checkExpectationsWorksHierarchicallyForLastCallNotFinished)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("first::foobar")->withParameter("boo", 1);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "first::foobar", expectations, expectations);

    mock("first").expectOneCall("foobar").withParameter("boo", 1);
    mock("first").actualCall("foobar");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}